

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.cpp
# Opt level: O1

void __thiscall
stateObservation::IndexedMatrixArray::writeInFile(IndexedMatrixArray *this,char *filename)

{
  uint uVar1;
  _Map_pointer ppMVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  reference pMVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ofstream f;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ofstream *)&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  ppMVar2 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uVar5 = (long)ppMVar2 -
          (long)(this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar8 = ((long)(this->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555;
  uVar7 = (long)(this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)(this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((int)(uVar7 >> 3) * -0x55555555 +
      ((int)(uVar5 >> 3) - (uint)(ppMVar2 != (_Map_pointer)0x0)) * 0x15 + (int)lVar8 == 0) {
LAB_0013e407:
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  uVar9 = 0;
  if ((((long)uVar5 >> 3) - (ulong)(ppMVar2 != (_Map_pointer)0x0)) * 0x15 + lVar8 !=
      ((long)uVar7 >> 3) * 0x5555555555555555) {
    uVar9 = (ulong)this->k_;
  }
  while( true ) {
    ppMVar2 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar8 = ((long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
            ((long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
            (((long)ppMVar2 -
              (long)(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppMVar2 == (_Map_pointer)0x0)) * 0x15;
    uVar5 = (ulong)((this->k_ - 1) + (int)lVar8);
    if (lVar8 == 0) {
      uVar5 = 0;
    }
    if (uVar5 < uVar9) goto LAB_0013e407;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    ppMVar2 = (this->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar8 = ((long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
            ((long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
            (((long)ppMVar2 -
              (long)(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppMVar2 == (_Map_pointer)0x0)) * 0x15;
    if (lVar8 == 0) break;
    uVar1 = this->k_;
    if (((uint)uVar9 < uVar1) || (lVar8 + (ulong)uVar1 <= (uVar9 & 0xffffffff))) break;
    pMVar6 = std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](&(this->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start,(ulong)((uint)uVar9 - uVar1));
    if (0 < (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows) {
      lVar8 = 0;
      do {
        if (0 < (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_cols) {
          lVar10 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
            lVar3 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows;
            if ((lVar3 <= lVar8) ||
               ((pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_cols <= lVar10)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                           );
            }
            std::ostream::_M_insert<double>
                      ((pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data[lVar3 * lVar10 + lVar8]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < (pMVar6->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_cols);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows);
    }
    cVar4 = (char)(ofstream *)&local_230;
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    uVar9 = uVar9 + 1;
  }
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
}

Assistant:

void IndexedMatrixArray::writeInFile(const char * filename)
    {
    	std::ofstream f;

      f.open(filename);

      if (size()>0)
      {

        for (size_t k=getFirstIndex();k<=getLastIndex();++k)
        {

            f << k;

            Matrix & m = operator[](k);

            for (int i = 0 ; i< m.rows(); ++i)
            {
              for (int j = 0 ; j< m.cols(); ++j)
              {
            		f << " "<< m(i,j);
              }
            }

            f << std::endl;
        }
      }
    }